

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O1

int Render_Single_Pass(black_PWorker worker,Bool flipped,Int y_min,Int y_max)

{
  Int *pIVar1;
  byte bVar2;
  ushort uVar3;
  char *pcVar4;
  FT_Pos *pFVar5;
  FT_Vector *pFVar6;
  Bool BVar7;
  char cVar8;
  uint uVar9;
  long lVar10;
  Long LVar11;
  PProfile pTVar12;
  long lVar13;
  ulong uVar14;
  PProfile pTVar15;
  int iVar16;
  undefined4 in_register_00000014;
  long lVar17;
  ulong uVar18;
  ushort uVar19;
  FT_Vector *pFVar20;
  FT_Pos *pFVar21;
  Int y;
  long lVar22;
  PProfile *ppTVar23;
  long lVar24;
  long lVar25;
  PProfile pTVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  FT_Vector *pFVar30;
  long lVar31;
  PProfile pTVar32;
  short sVar33;
  ulong uVar34;
  PProfile_conflict pTVar35;
  ulong uVar36;
  byte *pbVar37;
  byte *pbVar38;
  bool bVar39;
  TProfileList draw_left;
  TProfileList waiting;
  Int band_stack [32];
  PProfile local_110;
  PProfile local_108;
  FT_Vector *local_100;
  Long local_f8;
  Long local_f0;
  PProfile local_e8;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  uint auStack_b8 [34];
  
  local_c0 = CONCAT44(in_register_00000014,y_min);
  local_c8 = 0;
  local_d0 = 0;
LAB_0023f7f7:
  local_d8 = (long)(int)local_c0;
  do {
    worker->minY = (long)(int)local_c8 * (long)worker->precision;
    worker->maxY = worker->precision * local_d8;
    pTVar35 = (PProfile_conflict)worker->buff;
    worker->top = (PLong)pTVar35;
    worker->error = 0;
    worker->numTurns = 0;
    worker->fProfile = (PProfile_conflict)0x0;
    worker->fresh = '\0';
    worker->joint = '\0';
    worker->maxBuff = worker->sizeBuff + -8;
    worker->cProfile = pTVar35;
    pTVar35->offset = (PLong)pTVar35;
    worker->num_Profs = 0;
    if (0 < (worker->outline).n_contours) {
      uVar34 = 0;
      uVar19 = 0;
      do {
        worker->state = Unknown_State;
        worker->gProfile = (PProfile_conflict)0x0;
        pFVar20 = (worker->outline).points;
        uVar3 = (worker->outline).contours[uVar34];
        lVar28 = (long)worker->precision_scale;
        lVar24 = (long)worker->precision_half;
        lVar31 = pFVar20[uVar19].x * lVar28 - lVar24;
        lVar22 = pFVar20[uVar19].y * lVar28 - lVar24;
        lVar10 = pFVar20[uVar3].x * lVar28 - lVar24;
        lVar24 = lVar28 * pFVar20[uVar3].y - lVar24;
        lVar17 = lVar24;
        lVar28 = lVar22;
        if (flipped != '\0') {
          lVar17 = lVar10;
          lVar10 = lVar24;
          lVar28 = lVar31;
          lVar31 = lVar22;
        }
        pcVar4 = (worker->outline).tags;
        if ((pcVar4[uVar19] & 4U) != 0) {
          worker->dropOutControl = (byte)pcVar4[uVar19] >> 5;
        }
        pbVar37 = (byte *)(pcVar4 + uVar19);
        if ((*pbVar37 & 3) == 2) {
LAB_0023fd29:
          worker->error = 0x14;
LAB_0023fd30:
          bVar39 = false;
        }
        else {
          pFVar30 = pFVar20 + uVar3;
          pFVar20 = pFVar20 + uVar19;
          if ((*pbVar37 & 3) == 0) {
            if ((pcVar4[uVar3] & 3U) == 1) {
              pFVar30 = pFVar30 + -1;
            }
            else {
              lVar10 = (lVar10 + lVar31) / 2;
              lVar17 = (lVar17 + lVar28) / 2;
            }
            pFVar20 = pFVar20 + -1;
            pbVar37 = pbVar37 + -1;
            lVar28 = lVar17;
            lVar31 = lVar10;
          }
          worker->lastX = lVar31;
          worker->lastY = lVar28;
          pFVar6 = pFVar30;
          local_f8 = lVar31;
          local_f0 = lVar28;
          uVar36 = uVar34;
          if (pFVar20 < pFVar30) {
            do {
              local_e0 = uVar36;
              local_100 = pFVar6;
              pbVar38 = pbVar37 + 1;
              if ((pbVar37[1] & 3) == 0) {
                lVar28 = pFVar20[1].x * (long)worker->precision_scale - (long)worker->precision_half
                ;
                lVar31 = (long)worker->precision_scale * pFVar20[1].y - (long)worker->precision_half
                ;
                lVar17 = lVar31;
                if (flipped != '\0') {
                  lVar17 = lVar28;
                  lVar28 = lVar31;
                }
                pFVar5 = &pFVar20[2].y;
                do {
                  pFVar21 = pFVar5;
                  if (pFVar30 <= (FT_Vector *)(pFVar21 + -3)) {
                    cVar8 = Conic_To(worker,lVar28,lVar17,local_f8,local_f0);
                    uVar34 = local_e0;
                    goto joined_r0x0023fc6d;
                  }
                  lVar22 = ((FT_Vector *)(pFVar21 + -1))->x * (long)worker->precision_scale -
                           (long)worker->precision_half;
                  lVar31 = (long)worker->precision_scale * *pFVar21 - (long)worker->precision_half;
                  lVar10 = lVar31;
                  if (flipped == '\0') {
                    lVar10 = lVar22;
                  }
                  if (flipped != '\0') {
                    lVar31 = lVar22;
                  }
                  lVar22 = lVar17;
                  lVar24 = lVar28;
                  if ((pbVar38[1] & 3) == 0) {
                    BVar7 = Conic_To(worker,lVar28,lVar17,(lVar10 + lVar28) / 2,
                                     (lVar17 + lVar31) / 2);
                    lVar22 = lVar31;
                    lVar24 = lVar10;
                    if (BVar7 != '\0') {
                      lVar22 = lVar17;
                      lVar24 = lVar28;
                    }
                    cVar8 = (BVar7 == '\0') * '\x03' + '\f';
                    pFVar30 = local_100;
                  }
                  else {
                    cVar8 = '\x06';
                    if ((pbVar38[1] & 3) == 1) {
                      BVar7 = Conic_To(worker,lVar28,lVar17,lVar10,lVar31);
                      cVar8 = (BVar7 != '\0') * '\x05' + '\a';
                      pFVar30 = local_100;
                    }
                  }
                  pbVar38 = pbVar38 + 1;
                  pFVar5 = pFVar21 + 2;
                  lVar28 = lVar24;
                  lVar17 = lVar22;
                } while (cVar8 == '\x0f');
                uVar34 = local_e0;
                if (cVar8 == '\x06') goto LAB_0023fd29;
                if (cVar8 != '\a') goto LAB_0023fd30;
                pFVar20 = (FT_Vector *)(pFVar21 + -1);
              }
              else {
                pFVar6 = pFVar20 + 1;
                if ((pbVar37[1] & 3) == 1) {
                  LVar11 = pFVar20[1].x * (long)worker->precision_scale -
                           (long)worker->precision_half;
                  lVar17 = (long)worker->precision_scale * pFVar20[1].y -
                           (long)worker->precision_half;
                  lVar28 = lVar17;
                  if (flipped != '\0') {
                    lVar28 = LVar11;
                    LVar11 = lVar17;
                  }
                  BVar7 = Line_To(worker,LVar11,lVar28);
                  pFVar30 = local_100;
                  pFVar20 = pFVar6;
                  if (BVar7 != '\0') goto LAB_0023fd30;
                }
                else {
                  cVar8 = '\x06';
                  if ((pFVar20 + 2 <= pFVar30) && ((pbVar37[2] & 3) == 2)) {
                    lVar22 = (long)worker->precision_scale;
                    lVar24 = (long)worker->precision_half;
                    lVar31 = pFVar20[1].x * lVar22 - lVar24;
                    lVar13 = pFVar20[1].y * lVar22 - lVar24;
                    lVar25 = pFVar20[2].x * lVar22 - lVar24;
                    lVar10 = pFVar20[2].y * lVar22 - lVar24;
                    lVar28 = lVar25;
                    lVar17 = lVar13;
                    if (flipped != '\0') {
                      lVar28 = lVar10;
                      lVar17 = lVar31;
                      lVar31 = lVar13;
                      lVar10 = lVar25;
                    }
                    pFVar6 = pFVar20 + 3;
                    pbVar38 = pbVar37 + 3;
                    if (pFVar30 < pFVar6) {
                      BVar7 = Cubic_To(worker,lVar31,lVar17,lVar28,lVar10,local_f8,local_f0);
                      cVar8 = '\f';
                      pFVar30 = local_100;
                      if (BVar7 == '\0') {
                        cVar8 = '\x12';
                      }
                    }
                    else {
                      LVar11 = pFVar20[3].x * lVar22 - lVar24;
                      lVar24 = lVar22 * pFVar20[3].y - lVar24;
                      lVar22 = lVar24;
                      if (flipped != '\0') {
                        lVar22 = LVar11;
                        LVar11 = lVar24;
                      }
                      BVar7 = Cubic_To(worker,lVar31,lVar17,lVar28,lVar10,LVar11,lVar22);
                      cVar8 = (BVar7 != '\0') * '\x05' + '\a';
                      pFVar30 = local_100;
                    }
                  }
                  pFVar20 = pFVar6;
                  if (cVar8 != '\a') {
                    if (cVar8 == '\x06') goto LAB_0023fd29;
                    if (cVar8 != '\f') goto LAB_0023fc87;
                    goto LAB_0023fd30;
                  }
                }
              }
              pbVar37 = pbVar38;
              pFVar6 = local_100;
              uVar36 = local_e0;
            } while (pFVar20 < pFVar30);
          }
          cVar8 = Line_To(worker,local_f8,local_f0);
joined_r0x0023fc6d:
          if (cVar8 != '\0') goto LAB_0023fd30;
LAB_0023fc87:
          uVar36 = worker->lastY;
          sVar33 = (worker->outline).contours[uVar34];
          iVar27 = worker->precision;
          uVar14 = (long)iVar27 - 1U & uVar36;
          if ((((uVar14 == 0) && (worker->minY <= (long)uVar36)) && ((long)uVar36 <= worker->maxY))
             && ((worker->gProfile != (PProfile_conflict)0x0 &&
                 (((worker->cProfile->flags ^ worker->gProfile->flags) & 8) == 0)))) {
            worker->top = worker->top + -1;
          }
          pTVar35 = worker->cProfile;
          if ((worker->top == pTVar35->offset) || ((pTVar35->flags & 8) == 0)) {
            uVar14 = ((long)-iVar27 & (uVar36 + (long)iVar27) - 1) - uVar36;
          }
          uVar19 = sVar33 + 1;
          BVar7 = End_Profile(worker,(long)worker->precision_half <= (long)uVar14);
          if (BVar7 == '\0') {
            bVar39 = true;
            if (worker->gProfile != (PProfile)0x0) {
              pTVar35->next = worker->gProfile;
            }
          }
          else {
            bVar39 = false;
          }
        }
        if (!bVar39) goto LAB_0023fe32;
        uVar34 = uVar34 + 1;
      } while ((long)uVar34 < (long)(worker->outline).n_contours);
    }
    uVar19 = worker->num_Profs;
    pTVar35 = worker->fProfile;
    if (pTVar35 == (PProfile_conflict)0x0 || uVar19 < 2) {
      worker->fProfile = (PProfile_conflict)0x0;
    }
    else {
      do {
        if (uVar19 < 2) {
          pTVar12 = (PProfile)0x0;
        }
        else {
          pTVar12 = (PProfile)(pTVar35->offset + pTVar35->height);
        }
        pTVar35->link = pTVar12;
        iVar27 = (int)pTVar35->start;
        if ((pTVar35->flags & 8) == 0) {
          iVar16 = (iVar27 - (int)pTVar35->height) + 1;
          pTVar35->start = (long)iVar16;
          pTVar35->offset = pTVar35->offset + pTVar35->height + -1;
          y = iVar27 + 1;
          iVar27 = iVar16;
        }
        else {
          y = (int)pTVar35->height + iVar27;
        }
        BVar7 = Insert_Y_Turn(worker,iVar27);
        if (BVar7 == '\0') {
          BVar7 = Insert_Y_Turn(worker,y);
          bVar39 = BVar7 == '\0';
          if (bVar39) {
            pTVar35 = pTVar35->link;
          }
        }
        else {
          bVar39 = false;
        }
        if (!bVar39) goto LAB_0023fe32;
        uVar19 = uVar19 - 1;
      } while (uVar19 != 0);
    }
    if (worker->top < worker->maxBuff) break;
LAB_0023fe32:
    if (worker->error != 0x62) {
      return worker->error;
    }
    uVar9 = (uint)local_c8;
    if (uVar9 == (uint)local_c0) {
      return 0x62;
    }
    auStack_b8[(int)local_d0] = uVar9;
    local_d0 = (ulong)((int)local_d0 + 1);
    local_c8 = (ulong)(((int)((uint)local_c0 + uVar9) >> 1) + 1);
  } while( true );
  if (worker->fProfile != (PProfile)0x0) {
    local_e8 = (PProfile)0x0;
    local_108 = (PProfile)0x0;
    local_110 = (PProfile)0x0;
    bVar2 = (byte)worker->precision_bits;
    uVar36 = worker->minY >> (bVar2 & 0x3f);
    uVar34 = worker->maxY >> (bVar2 & 0x3f);
    pTVar12 = worker->fProfile;
    do {
      uVar14 = pTVar12->start;
      if ((short)uVar14 <= (short)uVar34) {
        uVar34 = uVar14;
      }
      uVar34 = uVar34 & 0xffffffff;
      uVar9 = ((int)uVar14 + (int)pTVar12->height) - 1;
      sVar33 = (short)uVar36;
      uVar36 = uVar36 & 0xffffffff;
      if (sVar33 <= (short)uVar9) {
        uVar36 = (ulong)uVar9;
      }
      pTVar32 = pTVar12->link;
      pTVar12->X = 0;
      pTVar15 = local_e8;
      ppTVar23 = &local_e8;
      if ((local_e8 != (PProfile)0x0) && (local_e8->X < 1)) {
        do {
          pTVar26 = pTVar15;
          pTVar15 = pTVar26->link;
          if (pTVar15 == (PProfile)0x0) break;
        } while (pTVar15->X < 1);
        ppTVar23 = &pTVar26->link;
      }
      pTVar12->link = pTVar15;
      *ppTVar23 = pTVar12;
      pTVar12 = pTVar32;
    } while (pTVar32 != (PProfile)0x0);
    local_d8 = CONCAT44(local_d8._4_4_,worker->numTurns);
    if (worker->numTurns == 0) {
      worker->error = 0x14;
    }
    else {
      sVar33 = (short)uVar34;
      (*worker->Proc_Sweep_Init)(worker,sVar33,(Short)uVar36);
      for (pTVar12 = local_e8; pTVar12 != (PProfile)0x0; pTVar12 = pTVar12->link) {
        pTVar12->countL = (int)pTVar12->start - (int)sVar33;
      }
      iVar27 = worker->numTurns;
      if ((0 < (long)iVar27) && (worker->sizeBuff[-(long)iVar27] == (long)sVar33)) {
        worker->numTurns = iVar27 + -1;
      }
      if (0 < worker->numTurns) {
        iVar27 = 0;
        local_e0 = uVar36;
LAB_0023ff77:
        if (local_e8 != (PProfile)0x0) {
          pTVar12 = local_e8;
          do {
            pTVar32 = pTVar12->link;
            pIVar1 = &pTVar12->countL;
            *pIVar1 = *pIVar1 - (int)(short)iVar27;
            if (*pIVar1 == 0) {
              if (local_e8 != (PProfile)0x0) {
                pTVar15 = local_e8;
                ppTVar23 = &local_e8;
                if (local_e8 != pTVar12) {
                  do {
                    pTVar26 = pTVar15;
                    pTVar15 = pTVar26->link;
                    if (pTVar15 == (PProfile)0x0) goto LAB_0023ffc7;
                  } while (pTVar15 != pTVar12);
                  ppTVar23 = &pTVar26->link;
                }
                *ppTVar23 = pTVar15->link;
              }
LAB_0023ffc7:
              lVar28 = pTVar12->X;
              if ((pTVar12->flags & 8) == 0) {
                ppTVar23 = &local_110;
                pTVar15 = local_110;
                if ((local_110 != (PProfile)0x0) && (local_110->X <= lVar28)) {
                  do {
                    pTVar26 = pTVar15;
                    pTVar15 = pTVar26->link;
                    if (pTVar15 == (PProfile)0x0) break;
                  } while (pTVar15->X <= lVar28);
LAB_0024001c:
                  ppTVar23 = &pTVar26->link;
                }
              }
              else {
                ppTVar23 = &local_108;
                pTVar15 = local_108;
                if ((local_108 != (PProfile)0x0) && (local_108->X <= lVar28)) {
                  do {
                    pTVar26 = pTVar15;
                    pTVar15 = pTVar26->link;
                    if (pTVar15 == (PProfile)0x0) break;
                  } while (pTVar15->X <= lVar28);
                  goto LAB_0024001c;
                }
              }
              pTVar12->link = pTVar15;
              *ppTVar23 = pTVar12;
            }
            pTVar12 = pTVar32;
          } while (pTVar32 != (PProfile)0x0);
        }
        Sort(&local_108);
        Sort(&local_110);
        iVar27 = worker->numTurns;
        worker->numTurns = iVar27 + -1;
        iVar27 = (int)worker->sizeBuff[-(long)iVar27];
        pTVar12 = local_108;
        iVar16 = (int)uVar34;
        if ((short)uVar34 < (short)iVar27) {
          local_f8 = CONCAT44(local_f8._4_4_,iVar27);
          local_f0 = CONCAT44(local_f0._4_4_,(int)uVar34);
          do {
            pTVar12 = local_108;
            pTVar32 = local_110;
            if (local_110 != (PProfile)0x0 && local_108 != (PProfile)0x0) {
              local_100 = (FT_Vector *)((ulong)local_100 & 0xffffffff00000000);
              pTVar26 = local_110;
              pTVar15 = local_108;
              do {
                uVar36 = pTVar15->X;
                uVar14 = pTVar26->X;
                lVar17 = uVar36 - uVar14;
                lVar28 = lVar17;
                if (lVar17 == 0 || (long)uVar36 < (long)uVar14) {
                  lVar28 = -(uVar36 - uVar14);
                }
                uVar18 = uVar14;
                if ((long)uVar36 < (long)uVar14) {
                  uVar18 = uVar36;
                }
                if (lVar17 != 0 && (long)uVar14 <= (long)uVar36) {
                  uVar14 = uVar36;
                }
                lVar17 = (long)worker->precision;
                if (lVar17 < lVar28) {
LAB_00240118:
                  (*worker->Proc_Sweep_Span)(worker,(Short)uVar34,uVar18,uVar14,pTVar15,pTVar26);
                }
                else {
                  uVar36 = uVar18 & -lVar17;
                  if (((uVar36 == uVar18) ||
                      (uVar29 = (uVar14 + lVar17) - 1 & -lVar17, uVar29 == uVar14)) ||
                     (((long)uVar36 <= (long)uVar29 && (uVar29 != uVar36 + lVar17))))
                  goto LAB_00240118;
                  if ((pTVar15->flags & 7) != 2) {
                    pTVar15->X = uVar18;
                    pTVar26->X = uVar14;
                    pTVar15->countL = 1;
                    local_100 = (FT_Vector *)CONCAT44(local_100._4_4_,(int)local_100 + 1);
                  }
                }
                pTVar15 = pTVar15->link;
              } while ((pTVar15 != (PProfile)0x0) &&
                      (pTVar26 = pTVar26->link, pTVar26 != (PProfile)0x0));
              if (0 < (short)local_100) {
                do {
                  if (pTVar12->countL != 0) {
                    pTVar12->countL = 0;
                    (*worker->Proc_Sweep_Drop)
                              (worker,(Short)uVar34,pTVar12->X,pTVar32->X,pTVar12,pTVar32);
                  }
                  pTVar12 = pTVar12->link;
                } while ((pTVar12 != (PProfile)0x0) &&
                        (pTVar32 = pTVar32->link, pTVar32 != (PProfile)0x0));
              }
            }
            (*worker->Proc_Sweep_Step)(worker);
            uVar9 = (int)uVar34 + 1;
            uVar34 = (ulong)uVar9;
            if ((short)iVar27 <= (short)uVar9) goto LAB_002401e9;
            Sort(&local_108);
            Sort(&local_110);
          } while( true );
        }
        goto LAB_00240206;
      }
LAB_002402c9:
      for (; (short)uVar34 <= (short)uVar36; uVar34 = (ulong)((int)uVar34 + 1)) {
        (*worker->Proc_Sweep_Step)(worker);
      }
    }
    if ((int)local_d8 == 0) {
      return worker->error;
    }
  }
  if ((int)local_d0 < 1) {
    return 0;
  }
  local_d0 = (ulong)((int)local_d0 - 1);
  local_c0 = (ulong)((int)local_c8 - 1);
  local_c8 = (ulong)auStack_b8[local_d0];
  goto LAB_0023f7f7;
LAB_002401e9:
  pTVar12 = local_108;
  iVar16 = (int)local_f0;
  uVar36 = local_e0;
  iVar27 = (int)local_f8;
LAB_00240206:
  pTVar32 = pTVar12;
  pTVar12 = local_110;
  if (pTVar32 != (PProfile)0x0) {
    pTVar12 = pTVar32->link;
    if (local_108 != (PProfile)0x0 && pTVar32->height == 0) {
      ppTVar23 = &local_108;
      pTVar15 = local_108;
      if (local_108 != pTVar32) {
        do {
          pTVar26 = pTVar15;
          pTVar15 = pTVar26->link;
          if (pTVar15 == (PProfile)0x0) goto LAB_00240206;
        } while (pTVar15 != pTVar32);
        ppTVar23 = &pTVar26->link;
      }
      *ppTVar23 = pTVar15->link;
    }
    goto LAB_00240206;
  }
LAB_00240259:
  pTVar32 = pTVar12;
  if (pTVar32 != (PProfile)0x0) {
    pTVar12 = pTVar32->link;
    if (local_110 != (PProfile)0x0 && pTVar32->height == 0) {
      ppTVar23 = &local_110;
      pTVar15 = local_110;
      if (local_110 != pTVar32) {
        do {
          pTVar26 = pTVar15;
          pTVar15 = pTVar26->link;
          if (pTVar15 == (PProfile)0x0) goto LAB_00240259;
        } while (pTVar15 != pTVar32);
        ppTVar23 = &pTVar26->link;
      }
      *ppTVar23 = pTVar15->link;
    }
    goto LAB_00240259;
  }
  iVar27 = iVar27 - iVar16;
  if (worker->numTurns < 1) goto LAB_002402c9;
  goto LAB_0023ff77;
}

Assistant:

static int
  Render_Single_Pass( RAS_ARGS Bool  flipped,
                               Int   y_min,
                               Int   y_max )
  {
    Int  y_mid;
    Int  band_top = 0;
    Int  band_stack[32];  /* enough to bisect 32-bit int bands */


    while ( 1 )
    {
      ras.minY = (Long)y_min * ras.precision;
      ras.maxY = (Long)y_max * ras.precision;

      ras.top = ras.buff;

      ras.error = Raster_Err_Ok;

      if ( Convert_Glyph( RAS_VARS flipped ) )
      {
        if ( ras.error != Raster_Err_Raster_Overflow )
          return ras.error;

        /* sub-banding */

        if ( y_min == y_max )
          return ras.error;  /* still Raster_Overflow */

        y_mid = ( y_min + y_max ) >> 1;

        band_stack[band_top++] = y_min;
        y_min                  = y_mid + 1;
      }
      else
      {
        if ( ras.fProfile )
          if ( Draw_Sweep( RAS_VAR ) )
             return ras.error;

        if ( --band_top < 0 )
          break;

        y_max = y_min - 1;
        y_min = band_stack[band_top];
      }
    }

    return Raster_Err_Ok;
  }